

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O3

bool __thiscall duckdb::Uhugeint::TryAddInPlace(Uhugeint *this,uhugeint_t *lhs,uhugeint_t rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = rhs.lower;
  uVar1 = *(ulong *)(this + 8);
  uVar3 = *(ulong *)this;
  *(long *)this = (long)&lhs->lower + *(long *)this;
  uVar3 = uVar1 + uVar2 + (ulong)CARRY8(uVar3,(ulong)lhs);
  *(ulong *)(this + 8) = uVar3;
  return (uVar2 <= uVar3 && uVar1 <= uVar3) && uVar1 <= uVar1 + uVar2;
}

Assistant:

bool Uhugeint::TryAddInPlace(uhugeint_t &lhs, uhugeint_t rhs) {
	uint64_t new_upper = lhs.upper + rhs.upper;
	bool no_overflow = !(new_upper < lhs.upper || new_upper < rhs.upper);
	new_upper += (lhs.lower + rhs.lower) < lhs.lower;
	if (new_upper < lhs.upper || new_upper < rhs.upper) {
		no_overflow = false;
	}
	lhs.upper = new_upper;
	lhs.lower += rhs.lower;
	return no_overflow;
}